

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O2

time_units __thiscall gmlc::utilities::timeUnitsFromString(utilities *this,string_view unitString)

{
  string_view input;
  string_view input_00;
  const_iterator cVar1;
  invalid_argument *this_00;
  time_units tVar2;
  string_view trimCharacters;
  undefined8 uStack_d0;
  string_view unitString_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string lcUstring;
  
  unitString_local._M_str = (char *)unitString._M_len;
  unitString_local._M_len = (size_t)this;
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
                  *)time_unitstrings,&unitString_local);
  if (cVar1._M_node == (_Base_ptr)(time_unitstrings + 8)) {
    input_00._M_str = unitString_local._M_str;
    input_00._M_len = unitString_local._M_len;
    trimCharacters._M_str = " \t\n\r";
    trimCharacters._M_len = 4;
    string_viewOps::trim(input_00,trimCharacters);
    input._M_str = (char *)unitString_local._M_len;
    input._M_len = uStack_d0;
    convertToLowerCase_abi_cxx11_(input);
    local_b8._M_dataplus._M_p = (pointer)lcUstring._M_string_length;
    local_b8._M_string_length = (size_type)lcUstring._M_dataplus._M_p;
    cVar1 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
                    *)time_unitstrings,(key_type *)&local_b8);
    if (cVar1._M_node == (_Base_ptr)(time_unitstrings + 8)) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"unit ",(allocator<char> *)((long)&uStack_d0 + 7));
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_98,&unitString_local,(allocator<char> *)((long)&uStack_d0 + 6));
      std::operator+(&local_58,&local_78,&local_98);
      std::operator+(&local_b8,&local_58," not recognized");
      std::invalid_argument::invalid_argument(this_00,(string *)&local_b8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    tVar2 = *(time_units *)&cVar1._M_node[1]._M_left;
    std::__cxx11::string::~string((string *)&lcUstring);
  }
  else {
    tVar2 = *(time_units *)&cVar1._M_node[1]._M_left;
  }
  return tVar2;
}

Assistant:

time_units timeUnitsFromString(std::string_view unitString)
{
    auto fnd = time_unitstrings.find(unitString);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    std::string lcUstring =
        convertToLowerCase(string_viewOps::trim(unitString));
    fnd = time_unitstrings.find(lcUstring);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    throw(std::invalid_argument(
        std::string("unit ") + std::string(unitString) + " not recognized"));
}